

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::JUnitReporter::JUnitTestCaseData::appendSubcaseNamesToLastTestcase
          (JUnitTestCaseData *this,
          vector<doctest::String,_std::allocator<doctest::String>_> nameStack)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  long in_RDX;
  long in_RSI;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (in_RSI != in_RDX) {
    do {
      if ((char)*(byte *)(in_RSI + 0x17) < '\0') {
        iVar2 = *(int *)(in_RSI + 8);
      }
      else {
        iVar2 = 0x17 - (*(byte *)(in_RSI + 0x17) & 0x1f);
      }
      if (iVar2 != 0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
        plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_60 = *plVar3;
          lStack_58 = plVar1[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar3;
          local_70 = (long *)*plVar1;
        }
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&(this->testcases).
                            super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].name,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      in_RSI = in_RSI + 0x18;
    } while (in_RSI != in_RDX);
  }
  return;
}

Assistant:

explicit Approx(const T& value,
                    typename detail::types::enable_if<std::is_constructible<double, T>::value>::type* =
                            static_cast<T*>(nullptr)) {
        *this = static_cast<double>(value);
    }